

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O1

bool __thiscall
cmCTestHandlerCommand::InitialPass
          (cmCTestHandlerCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  size_type sVar4;
  cmCTest *pcVar5;
  long lVar6;
  uint __val;
  cmExecutionStatus *pcVar7;
  pointer pbVar8;
  pointer pbVar9;
  uint uVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  _Var15;
  undefined8 *puVar16;
  cmValue cVar17;
  long *plVar18;
  char *pcVar19;
  ostream *poVar20;
  string *psVar21;
  undefined4 extraout_var;
  size_t sVar22;
  uint uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  size_type *psVar25;
  long *plVar26;
  bool bVar27;
  string *name;
  char *__s;
  uint __len;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  SaveRestoreErrorState errorState;
  cmWorkingDirectory workdir;
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  SaveRestoreErrorState local_2ba;
  cmWorkingDirectory local_2b8;
  string local_290;
  size_type local_270;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined8 local_248;
  char *local_240;
  ios_base local_1f8 [264];
  string *local_f0;
  cmMakefile *local_e8;
  cmExecutionStatus *local_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80;
  ParseResult local_60;
  
  local_2ba.InitialErrorState = true;
  if ((!cmSystemTools::s_ErrorOccurred) && (!cmSystemTools::s_FatalErrorOccurred)) {
    local_2ba.InitialErrorState = cmSystemTools::GetInterruptFlag();
  }
  cmSystemTools::s_FatalErrorOccurred = false;
  cmSystemTools::s_ErrorOccurred = false;
  local_2ba.CaptureCMakeErrorValue = false;
  (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[7])(this);
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_60,&this->super_cmArgumentParser<void>,args,&local_98,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_60);
  (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[8])(this);
  pbVar1 = (this->ParsedKeywords).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->ParsedKeywords).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    uVar14 = (long)pbVar2 - (long)pbVar1 >> 4;
    lVar6 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar1,pbVar2,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar1,pbVar2);
  }
  _Var15 = std::
           __adjacent_find<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     ((this->ParsedKeywords).
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->ParsedKeywords).
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var15._M_current !=
      (this->ParsedKeywords).
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_258._M_allocated_capacity = (_Var15._M_current)->_M_len;
    local_258._8_8_ = (_Var15._M_current)->_M_str;
    local_268._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x24;
    local_268._8_8_ = "Called with more than one value for ";
    views._M_len = 2;
    views._M_array = (iterator)local_268;
    cmCatViews_abi_cxx11_(&local_2b8.OldDir,views);
    cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_2b8.OldDir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.OldDir._M_dataplus._M_p != &local_2b8.OldDir.field_2) {
      operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                      local_2b8.OldDir.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar9 = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_258._8_8_ =
         ((local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_258._M_allocated_capacity =
         (local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_268._0_8_ = &DAT_0000001e;
    local_268._8_8_ = "called with unknown argument \"";
    local_248 = 2;
    local_240 = "\".";
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_268;
    cmCatViews_abi_cxx11_(&local_2b8.OldDir,views_00);
    cmCommand::SetError((cmCommand *)this,&local_2b8.OldDir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.OldDir._M_dataplus._M_p != &local_2b8.OldDir.field_2) {
      operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                      local_2b8.OldDir.field_2._M_allocated_capacity + 1);
    }
  }
  sVar4 = (this->CaptureCMakeError)._M_string_length;
  if (sVar4 != 0) {
    local_2ba.CaptureCMakeErrorValue = true;
  }
  name = &this->CaptureCMakeError;
  if (pbVar8 == pbVar9) {
    pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_270 = sVar4;
    local_268._0_8_ = &local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_268,"CTEST_CONFIGURATION_TYPE","");
    cVar17 = cmMakefile::GetDefinition(pcVar3,(string *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ != &local_258) {
      operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
    }
    if (cVar17.Value != (string *)0x0) {
      cmCTest::SetConfigType((this->super_cmCTestCommand).CTest,cVar17.Value);
    }
    if ((this->Build)._M_string_length == 0) {
      pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      local_268._0_8_ = &local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_268,"CTEST_BINARY_DIRECTORY","");
      psVar21 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._0_8_ != &local_258) {
        operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
      }
      if (psVar21->_M_string_length != 0) {
        pcVar5 = (this->super_cmCTestCommand).CTest;
        cmsys::SystemTools::CollapseFullPath((string *)local_268,psVar21);
        cmCTest::SetCTestConfiguration(pcVar5,"BuildDirectory",(string *)local_268,this->Quiet);
        goto LAB_001fda75;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"CTEST_BINARY_DIRECTORY not set",0x1e);
      std::ios::widen((char)(ostream *)local_268 + (char)*(undefined8 *)(local_268._0_8_ + -0x18));
      std::ostream::put((char)local_268);
      std::ostream::flush();
      pcVar5 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x92,local_2b8.OldDir._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8.OldDir._M_dataplus._M_p != &local_2b8.OldDir.field_2) {
        operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                        local_2b8.OldDir.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
      std::ios_base::~ios_base(local_1f8);
    }
    else {
      pcVar5 = (this->super_cmCTestCommand).CTest;
      cmsys::SystemTools::CollapseFullPath((string *)local_268,&this->Build);
      cmCTest::SetCTestConfiguration(pcVar5,"BuildDirectory",(string *)local_268,this->Quiet);
LAB_001fda75:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._0_8_ != &local_258) {
        operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
      }
    }
    if ((this->Source)._M_string_length == 0) {
      pcVar5 = (this->super_cmCTestCommand).CTest;
      pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      paVar24 = &local_2b8.OldDir.field_2;
      local_2b8.OldDir._M_dataplus._M_p = (pointer)paVar24;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,"CTEST_SOURCE_DIRECTORY","");
      psVar21 = cmMakefile::GetSafeDefinition(pcVar3,&local_2b8.OldDir);
      cmsys::SystemTools::CollapseFullPath((string *)local_268,psVar21);
      cmCTest::SetCTestConfiguration(pcVar5,"SourceDirectory",(string *)local_268,this->Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._0_8_ != &local_258) {
        operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8.OldDir._M_dataplus._M_p != paVar24) {
        operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                        local_2b8.OldDir.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"Set source directory to: ",0x19);
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_268,(this->Source)._M_dataplus._M_p,
                           (this->Source)._M_string_length);
      std::ios::widen((char)poVar20->_vptr_basic_ostream[-3] + (char)poVar20);
      std::ostream::put((char)poVar20);
      std::ostream::flush();
      pcVar5 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x97,local_2b8.OldDir._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8.OldDir._M_dataplus._M_p != &local_2b8.OldDir.field_2) {
        operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                        local_2b8.OldDir.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
      std::ios_base::~ios_base(local_1f8);
      pcVar5 = (this->super_cmCTestCommand).CTest;
      cmsys::SystemTools::CollapseFullPath((string *)local_268,&this->Source);
      cmCTest::SetCTestConfiguration(pcVar5,"SourceDirectory",(string *)local_268,this->Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._0_8_ != &local_258) {
        operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
      }
    }
    pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_268._0_8_ = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"CTEST_CHANGE_ID","");
    cVar17 = cmMakefile::GetDefinition(pcVar3,(string *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ != &local_258) {
      operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
    }
    if (cVar17.Value != (string *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestCommand).CTest,"ChangeId",cVar17.Value,this->Quiet);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"Initialize handler",0x12);
    std::ios::widen((char)(ostream *)local_268 + (char)*(size_t *)(local_268._0_8_ + -0x18));
    std::ostream::put((char)local_268);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                 ,0xa7,local_2b8.OldDir._M_dataplus._M_p,false);
    paVar24 = &local_2b8.OldDir.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.OldDir._M_dataplus._M_p != paVar24) {
      operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                      local_2b8.OldDir.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
    std::ios_base::~ios_base(local_1f8);
    iVar12 = (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[5])(this);
    plVar18 = (long *)CONCAT44(extraout_var,iVar12);
    if (plVar18 != (long *)0x0) {
      *(bool *)(plVar18 + 1) = this->Append;
      (**(code **)*plVar18)(plVar18,(this->super_cmCTestCommand).super_cmCommand.Makefile);
      if ((this->SubmitIndex)._M_string_length != 0) {
        iVar12 = atoi((this->SubmitIndex)._M_dataplus._M_p);
        *(int *)(plVar18 + 0x23) = iVar12;
      }
      pcVar5 = (this->super_cmCTestCommand).CTest;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"BuildDirectory","");
      cmCTest::GetCTestConfiguration((string *)local_268,pcVar5,&local_290);
      cmWorkingDirectory::cmWorkingDirectory(&local_2b8,(string *)local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._0_8_ != &local_258) {
        operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8.ResultCode == 0) {
        local_e0 = status;
        uVar13 = (**(code **)(*plVar18 + 8))(plVar18);
        if ((this->ReturnValue)._M_string_length != 0) {
          __val = -uVar13;
          if (0 < (int)uVar13) {
            __val = uVar13;
          }
          __len = 1;
          if (9 < __val) {
            uVar14 = (ulong)__val;
            uVar10 = 4;
            do {
              __len = uVar10;
              uVar23 = (uint)uVar14;
              if (uVar23 < 100) {
                __len = __len - 2;
                goto LAB_001fe498;
              }
              if (uVar23 < 1000) {
                __len = __len - 1;
                goto LAB_001fe498;
              }
              if (uVar23 < 10000) goto LAB_001fe498;
              uVar14 = uVar14 / 10000;
              uVar10 = __len + 4;
            } while (99999 < uVar23);
            __len = __len + 1;
          }
LAB_001fe498:
          local_e8 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
          local_268._0_8_ = &local_258;
          local_f0 = name;
          std::__cxx11::string::_M_construct
                    ((ulong)local_268,(char)__len - (char)((int)uVar13 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)(local_268._0_8_ + (ulong)(uVar13 >> 0x1f)),__len,__val);
          value_02._M_str = (char *)local_268._0_8_;
          value_02._M_len = local_268._8_8_;
          cmMakefile::AddDefinition(local_e8,&this->ReturnValue,value_02);
          name = local_f0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._0_8_ != &local_258) {
            operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
          }
        }
        (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[6])(this,plVar18);
        pcVar7 = local_e0;
        bVar27 = true;
        if (local_270 != 0) {
          if (((cmSystemTools::s_ErrorOccurred != false) ||
              (cmSystemTools::s_FatalErrorOccurred != false)) ||
             (bVar11 = cmSystemTools::GetInterruptFlag(), bVar11)) {
            pcVar19 = cmsys::SystemTools::FindLastString
                                ((pcVar7->Error)._M_dataplus._M_p,"unknown error.");
            __s = "-1";
            if (pcVar19 == (char *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,(pcVar7->Error)._M_dataplus._M_p,
                         (pcVar7->Error)._M_string_length);
              pcVar5 = (this->super_cmCTestCommand).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar5,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                           ,0xdc,local_290._M_dataplus._M_p,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p,
                                local_290.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
              std::ios_base::~ios_base(local_1f8);
            }
          }
          else {
            __s = "0";
          }
          pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
          sVar22 = strlen(__s);
          value_03._M_str = __s;
          value_03._M_len = sVar22;
          cmMakefile::AddDefinition(pcVar3,name,value_03);
        }
      }
      else {
        pcVar5 = (this->super_cmCTestCommand).CTest;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"BuildDirectory","");
        cmCTest::GetCTestConfiguration(&local_80,pcVar5,&local_b8);
        plVar18 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x75a75b);
        plVar26 = plVar18 + 2;
        if ((long *)*plVar18 == plVar26) {
          local_c8 = *plVar26;
          lStack_c0 = plVar18[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar26;
          local_d8 = (long *)*plVar18;
        }
        local_d0 = plVar18[1];
        *plVar18 = (long)plVar26;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        psVar25 = (size_type *)(plVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar18 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar25) {
          local_290.field_2._M_allocated_capacity = *psVar25;
          local_290.field_2._8_8_ = plVar18[3];
        }
        else {
          local_290.field_2._M_allocated_capacity = *psVar25;
          local_290._M_dataplus._M_p = (pointer)*plVar18;
        }
        local_290._M_string_length = plVar18[1];
        *plVar18 = (long)psVar25;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        strerror(local_2b8.ResultCode);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
        local_268._0_8_ = &local_258;
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar24) {
          local_258._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_258._8_8_ = puVar16[3];
        }
        else {
          local_258._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_268._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar16;
        }
        local_268._8_8_ = puVar16[1];
        *puVar16 = paVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cmCommand::SetError((cmCommand *)this,(string *)local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._0_8_ != &local_258) {
          operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_270 == 0) {
          bVar27 = false;
        }
        else {
          value_01._M_str = "-1";
          value_01._M_len = 2;
          cmMakefile::AddDefinition
                    ((this->super_cmCTestCommand).super_cmCommand.Makefile,name,value_01);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
          (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[4])(&local_290,this);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_268,local_290._M_dataplus._M_p,
                               local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar20,(status->Error)._M_dataplus._M_p,
                               (status->Error)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          pcVar5 = (this->super_cmCTestCommand).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                       ,199,local_290._M_dataplus._M_p,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
          std::ios_base::~ios_base(local_1f8);
          bVar27 = true;
        }
      }
      cmWorkingDirectory::~cmWorkingDirectory(&local_2b8);
      goto LAB_001fe63f;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"Cannot instantiate test handler ",0x20);
    (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[4])(&local_2b8,this);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,local_2b8.OldDir._M_dataplus._M_p,
                         local_2b8.OldDir._M_string_length);
    std::ios::widen((char)poVar20->_vptr_basic_ostream[-3] + (char)poVar20);
    std::ostream::put((char)poVar20);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.OldDir._M_dataplus._M_p != paVar24) {
      operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                      local_2b8.OldDir.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                 ,0xac,local_2b8.OldDir._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.OldDir._M_dataplus._M_p != paVar24) {
      operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                      local_2b8.OldDir.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
    std::ios_base::~ios_base(local_1f8);
    if (local_270 != 0) {
      value_00._M_str = "-1";
      value_00._M_len = 2;
      cmMakefile::AddDefinition((this->super_cmCTestCommand).super_cmCommand.Makefile,name,value_00)
      ;
      pcVar19 = cmsys::SystemTools::FindLastString
                          ((status->Error)._M_dataplus._M_p,"unknown error.");
      bVar27 = true;
      if (pcVar19 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_268,(status->Error)._M_dataplus._M_p,
                             (status->Error)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," error from command\n",0x14);
        pcVar5 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                     ,0xb1,local_2b8.OldDir._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8.OldDir._M_dataplus._M_p != paVar24) {
          operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                          local_2b8.OldDir.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
        std::ios_base::~ios_base(local_1f8);
      }
      goto LAB_001fe63f;
    }
  }
  else if (sVar4 != 0) {
    value._M_str = "-1";
    value._M_len = 2;
    cmMakefile::AddDefinition((this->super_cmCTestCommand).super_cmCommand.Makefile,name,value);
    (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[4])(&local_290,this);
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar24) {
      local_258._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_258._8_8_ = puVar16[3];
      local_268._0_8_ = &local_258;
    }
    else {
      local_258._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_268._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar16;
    }
    local_268._8_8_ = puVar16[1];
    *puVar16 = paVar24;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    plVar18 = (long *)std::__cxx11::string::_M_append
                                (local_268,(ulong)(status->Error)._M_dataplus._M_p);
    paVar24 = &local_2b8.OldDir.field_2;
    psVar25 = (size_type *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar25) {
      local_2b8.OldDir.field_2._M_allocated_capacity = *psVar25;
      local_2b8.OldDir.field_2._8_8_ = plVar18[3];
      local_2b8.OldDir._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_2b8.OldDir.field_2._M_allocated_capacity = *psVar25;
      local_2b8.OldDir._M_dataplus._M_p = (pointer)*plVar18;
    }
    local_2b8.OldDir._M_string_length = plVar18[1];
    *plVar18 = (long)psVar25;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ != &local_258) {
      operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    pcVar19 = cmsys::SystemTools::FindLastString(local_2b8.OldDir._M_dataplus._M_p,"unknown error.")
    ;
    if (pcVar19 == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_268,local_2b8.OldDir._M_dataplus._M_p,
                           local_2b8.OldDir._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," error from command\n",0x14);
      pcVar5 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x73,local_290._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
      std::ios_base::~ios_base(local_1f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.OldDir._M_dataplus._M_p != paVar24) {
      operator_delete(local_2b8.OldDir._M_dataplus._M_p,
                      local_2b8.OldDir.field_2._M_allocated_capacity + 1);
    }
    bVar27 = true;
    goto LAB_001fe63f;
  }
  bVar27 = false;
LAB_001fe63f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  anon_unknown.dwarf_4f3c68::SaveRestoreErrorState::~SaveRestoreErrorState(&local_2ba);
  return bVar27;
}

Assistant:

bool cmCTestHandlerCommand::InitialPass(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  // save error state and restore it if needed
  SaveRestoreErrorState errorState;
  // Allocate space for argument values.
  this->BindArguments();

  // Process input arguments.
  std::vector<std::string> unparsedArguments;
  this->Parse(args, &unparsedArguments);
  this->CheckArguments();

  std::sort(this->ParsedKeywords.begin(), this->ParsedKeywords.end());
  auto it = std::adjacent_find(this->ParsedKeywords.begin(),
                               this->ParsedKeywords.end());
  if (it != this->ParsedKeywords.end()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Called with more than one value for ", *it));
  }

  bool const foundBadArgument = !unparsedArguments.empty();
  if (foundBadArgument) {
    this->SetError(cmStrCat("called with unknown argument \"",
                            unparsedArguments.front(), "\"."));
  }
  bool const captureCMakeError = !this->CaptureCMakeError.empty();
  // now that arguments are parsed check to see if there is a
  // CAPTURE_CMAKE_ERROR specified let the errorState object know.
  if (captureCMakeError) {
    errorState.CaptureCMakeError();
  }
  // if we found a bad argument then exit before running command
  if (foundBadArgument) {
    // store the cmake error
    if (captureCMakeError) {
      this->Makefile->AddDefinition(this->CaptureCMakeError, "-1");
      std::string const err = this->GetName() + " " + status.GetError();
      if (!cmSystemTools::FindLastString(err.c_str(), "unknown error.")) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, err << " error from command\n");
      }
      // return success because failure is recorded in CAPTURE_CMAKE_ERROR
      return true;
    }
    // return failure because of bad argument
    return false;
  }

  // Set the config type of this ctest to the current value of the
  // CTEST_CONFIGURATION_TYPE script variable if it is defined.
  // The current script value trumps the -C argument on the command
  // line.
  cmValue ctestConfigType =
    this->Makefile->GetDefinition("CTEST_CONFIGURATION_TYPE");
  if (ctestConfigType) {
    this->CTest->SetConfigType(*ctestConfigType);
  }

  if (!this->Build.empty()) {
    this->CTest->SetCTestConfiguration(
      "BuildDirectory", cmSystemTools::CollapseFullPath(this->Build),
      this->Quiet);
  } else {
    std::string const& bdir =
      this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");
    if (!bdir.empty()) {
      this->CTest->SetCTestConfiguration(
        "BuildDirectory", cmSystemTools::CollapseFullPath(bdir), this->Quiet);
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "CTEST_BINARY_DIRECTORY not set" << std::endl;);
    }
  }
  if (!this->Source.empty()) {
    cmCTestLog(this->CTest, DEBUG,
               "Set source directory to: " << this->Source << std::endl);
    this->CTest->SetCTestConfiguration(
      "SourceDirectory", cmSystemTools::CollapseFullPath(this->Source),
      this->Quiet);
  } else {
    this->CTest->SetCTestConfiguration(
      "SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY")),
      this->Quiet);
  }

  if (cmValue changeId = this->Makefile->GetDefinition("CTEST_CHANGE_ID")) {
    this->CTest->SetCTestConfiguration("ChangeId", *changeId, this->Quiet);
  }

  cmCTestLog(this->CTest, DEBUG, "Initialize handler" << std::endl;);
  cmCTestGenericHandler* handler = this->InitializeHandler();
  if (!handler) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot instantiate test handler " << this->GetName()
                                                  << std::endl);
    if (captureCMakeError) {
      this->Makefile->AddDefinition(this->CaptureCMakeError, "-1");
      std::string const& err = status.GetError();
      if (!cmSystemTools::FindLastString(err.c_str(), "unknown error.")) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, err << " error from command\n");
      }
      return true;
    }
    return false;
  }

  handler->SetAppendXML(this->Append);

  handler->PopulateCustomVectors(this->Makefile);
  if (!this->SubmitIndex.empty()) {
    handler->SetSubmitIndex(atoi(this->SubmitIndex.c_str()));
  }
  cmWorkingDirectory workdir(
    this->CTest->GetCTestConfiguration("BuildDirectory"));
  if (workdir.Failed()) {
    this->SetError("failed to change directory to " +
                   this->CTest->GetCTestConfiguration("BuildDirectory") +
                   " : " + std::strerror(workdir.GetLastResult()));
    if (captureCMakeError) {
      this->Makefile->AddDefinition(this->CaptureCMakeError, "-1");
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 this->GetName() << " " << status.GetError() << "\n");
      // return success because failure is recorded in CAPTURE_CMAKE_ERROR
      return true;
    }
    return false;
  }

  int res = handler->ProcessHandler();
  if (!this->ReturnValue.empty()) {
    this->Makefile->AddDefinition(this->ReturnValue, std::to_string(res));
  }
  this->ProcessAdditionalValues(handler);
  // log the error message if there was an error
  if (captureCMakeError) {
    const char* returnString = "0";
    if (cmSystemTools::GetErrorOccurredFlag()) {
      returnString = "-1";
      std::string const& err = status.GetError();
      // print out the error if it is not "unknown error" which means
      // there was no message
      if (!cmSystemTools::FindLastString(err.c_str(), "unknown error.")) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, err);
      }
    }
    // store the captured cmake error state 0 or -1
    this->Makefile->AddDefinition(this->CaptureCMakeError, returnString);
  }
  return true;
}